

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

shared_ptr<gui::Button> __thiscall gui::DialogBox::getOptionButton(DialogBox *this,size_t index)

{
  size_type sVar1;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Button> sVar3;
  element_type *this_00;
  
  this_00 = in_RDI;
  sVar1 = std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
          ::size((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                  *)(in_RSI + 0x248));
  if (in_RDX < sVar1) {
    std::vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>::
    operator[]((vector<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                *)(in_RSI + 0x248),in_RDX);
    std::shared_ptr<gui::Button>::shared_ptr
              ((shared_ptr<gui::Button> *)this_00,(shared_ptr<gui::Button> *)in_RDI);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<gui::Button>::shared_ptr((shared_ptr<gui::Button> *)this_00,in_RDI);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<gui::Button>)sVar3.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Button> DialogBox::getOptionButton(size_t index) const {
    if (index < optionButtons_.size()) {
        return optionButtons_[index];
    }
    return nullptr;
}